

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# attr.c
# Opt level: O2

int replace_attr(attr_list list,atom_t attr_id,attr_value_type val_type,attr_value val)

{
  int_attr_struct *piVar1;
  attr_p paVar2;
  ulong uVar3;
  long lVar4;
  ulong uVar5;
  long lVar6;
  
  if (list->list_of_lists != 0) {
    __assert_fail("list->list_of_lists == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/ornladios[P]ADIOS2/thirdparty/atl/atl/attr.c"
                  ,0x2bd,"int replace_attr(attr_list, atom_t, attr_value_type, attr_value)");
  }
  if (val_type == Attr_Int4) {
    piVar1 = (list->l).list.iattrs;
    uVar3 = 0;
    do {
      uVar5 = uVar3;
      if (piVar1->int_attr_count == uVar5) {
        return 0;
      }
      uVar3 = uVar5 + 1;
    } while (piVar1->iattr[uVar5].attr_id != attr_id);
    piVar1->iattr[uVar5].value = (int4)val;
  }
  else {
    lVar4 = 0;
    do {
      lVar6 = lVar4;
      if ((ulong)((list->l).list.iattrs)->other_attr_count * 0x18 + 0x18 == lVar6 + 0x18) {
        return 0;
      }
      paVar2 = (list->l).list.attributes;
      lVar4 = lVar6 + 0x18;
    } while (*(int *)((long)&paVar2->attr_id + lVar6) != attr_id);
    *(attr_value_type *)((long)&paVar2->val_type + lVar6) = val_type;
    paVar2 = (list->l).list.attributes;
    *(int4 *)((long)&(paVar2->value).u + lVar6) = (int4)val;
    *(int *)((long)&(paVar2->value).u + lVar6 + 4) = (int)((ulong)val >> 0x20);
  }
  return 1;
}

Assistant:

extern int
replace_attr(attr_list list, atom_t attr_id, attr_value_type val_type, attr_value val)
{
    int index = 0;
    attr_union value;
    assert(list->list_of_lists == 0);
    switch(val_type) {
    case Attr_Int8:
        if (sizeof(long) == 8) {
            value.u.l = (long) val;
        }
    case Attr_Int4:
    case Attr_Atom:
        if (sizeof(int) == 4) {
            value.u.i = (long)val;
        }
        break;
    case Attr_Float16:
        if (sizeof(double) == 16) {
            value.u.d = *(double*)&val;
            break;
        }
    case Attr_Float8:
        if (sizeof(double) == 8) {
            value.u.d = *(double*)&val;
            break;
        } else if (sizeof(float) == 8) {
            value.u.f = *(float*)&val;
            break;
        }
    case Attr_Float4:
        if (sizeof(double) == 4) {
            value.u.d = *(double*)&val;
            break;
        } else if (sizeof(float) == 4) {
            value.u.f = *(float*)&val;
            break;
        }
    case Attr_Opaque:
        value.u.o = *(attr_opaque_p)&val;
        break;
    case Attr_String:
    case Attr_List:
        value.u.p = (void*)val;
        break;
    case Attr_Undefined:
        break;
    }
    if (val_type == Attr_Int4) {
	while (index < list->l.list.iattrs->int_attr_count) {
	    if (list->l.list.iattrs->iattr[index].attr_id == attr_id) {
		list->l.list.iattrs->iattr[index].value = value.u.i;
		return 1;
	    }
	    index++;
	}
    } else {
	while (index < list->l.list.iattrs->other_attr_count) {
	    if (list->l.list.attributes[index].attr_id == attr_id) {
		list->l.list.attributes[index].val_type = val_type;
		list->l.list.attributes[index].value = value;
		return 1;
	    }
	    index++;
	}
    }
    return 0;  
}